

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

void cs_impl::list_cs_ext::push_front(list *lst,var *val)

{
  any *in_RDI;
  any *in_stack_ffffffffffffffb8;
  EVP_PKEY_CTX *src;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_ffffffffffffffd0;
  EVP_PKEY_CTX local_20 [8];
  EVP_PKEY_CTX local_18 [24];
  
  src = local_20;
  any::any(in_RDI,in_stack_ffffffffffffffb8);
  cs::copy(local_18,src);
  std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::push_front
            (in_stack_ffffffffffffffd0,(value_type *)src);
  any::~any((any *)0x435538);
  any::~any((any *)0x435542);
  return;
}

Assistant:

void push_front(list &lst, const var &val)
		{
			lst.push_front(copy(val));
		}